

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum_helpers.hpp
# Opt level: O2

void __thiscall
duckdb::IntervalAdd::AddConstant<duckdb::IntervalAvgState,duckdb::interval_t>
          (IntervalAdd *this,IntervalAvgState *state,interval_t input,idx_t count)

{
  long lVar1;
  unsigned_long input_00;
  interval_t iVar2;
  
  input_00 = input.micros;
  lVar1 = Cast::Operation<unsigned_long,long>(input_00);
  iVar2.micros = lVar1;
  iVar2.months = (int)input._0_8_;
  iVar2.days = (int)((ulong)input._0_8_ >> 0x20);
  iVar2 = MultiplyOperator::Operation<duckdb::interval_t,long,duckdb::interval_t>
                    ((MultiplyOperator *)state,iVar2,input_00);
  iVar2 = AddOperator::Operation<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t>
                    (*(interval_t *)(this + 8),iVar2);
  *(interval_t *)(this + 8) = iVar2;
  return;
}

Assistant:

static void AddConstant(STATE &state, T input, idx_t count) {
		const auto count64 = Cast::Operation<idx_t, int64_t>(count);
		input = MultiplyOperator::Operation<interval_t, int64_t, interval_t>(input, count64);
		state.value = AddOperator::Operation<interval_t, interval_t, interval_t>(state.value, input);
	}